

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.cpp
# Opt level: O0

bool __thiscall MeCab::StringBuffer::reserve(StringBuffer *this,size_t length)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  char *new_ptr;
  size_t len;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    *(bool *)(in_RDI + 0x21) = *(ulong *)(in_RDI + 0x10) <= (ulong)(*(long *)(in_RDI + 8) + in_RSI);
    local_1 = (bool)((*(byte *)(in_RDI + 0x21) ^ 0xff) & 1);
  }
  else {
    if (*(ulong *)(in_RDI + 0x10) <= (ulong)(*(long *)(in_RDI + 8) + in_RSI)) {
      if (*(long *)(in_RDI + 0x10) == 0) {
        *(undefined8 *)(in_RDI + 0x10) = 0x2000;
        pvVar1 = operator_new__(*(ulong *)(in_RDI + 0x10));
        *(void **)(in_RDI + 0x18) = pvVar1;
      }
      do {
        *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) << 1;
      } while (*(ulong *)(in_RDI + 0x10) <= (ulong)(*(long *)(in_RDI + 8) + in_RSI));
      pvVar1 = operator_new__(*(ulong *)(in_RDI + 0x10));
      memcpy(pvVar1,*(void **)(in_RDI + 0x18),*(size_t *)(in_RDI + 8));
      if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x18));
      }
      *(void **)(in_RDI + 0x18) = pvVar1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StringBuffer::reserve(size_t length) {
  if (!is_delete_) {
    error_ = (size_ + length >= alloc_size_);
    return (!error_);
  }

  if (size_ + length >= alloc_size_) {
    if (alloc_size_ == 0) {
      alloc_size_ = DEFAULT_ALLOC_SIZE;
      ptr_ = new char[alloc_size_];
    }
    size_t len = size_ + length;
    do {
      alloc_size_ *= 2;
    } while (len >= alloc_size_);
    char *new_ptr = new char[alloc_size_];
    std::memcpy(new_ptr, ptr_, size_);
    delete [] ptr_;
    ptr_ = new_ptr;
  }

  return true;
}